

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlWriter::XmlWriter(XmlWriter *this)

{
  ostream *poVar1;
  XmlWriter *this_local;
  
  this->m_tagIsOpen = false;
  this->m_needsNewline = false;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_tags);
  std::__cxx11::string::string((string *)&this->m_indent);
  poVar1 = cout();
  this->m_os = poVar1;
  std::operator<<(this->m_os,"<?xml version=\"1.1\" encoding=\"UTF-8\"?>\n");
  return;
}

Assistant:

XmlWriter()
        :   m_tagIsOpen( false ),
            m_needsNewline( false ),
            m_os( &Catch::cout() )
        {
            // We encode control characters, which requires
            // XML 1.1
            // see http://stackoverflow.com/questions/404107/why-are-control-characters-illegal-in-xml-1-0
            *m_os << "<?xml version=\"1.1\" encoding=\"UTF-8\"?>\n";
        }